

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O1

void fiobj_ary_push(FIOBJ ary,FIOBJ obj)

{
  if ((((ary != 0) && ((~(uint)ary & 6) != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    if (*(ulong *)(ary + 0x18) <= *(ulong *)(ary + 0x10)) {
      fio_ary_____require_on_top((fio_ary___s *)(ary + 8),5);
    }
    if (*(long *)(ary + 8) == *(long *)(ary + 0x10)) {
      ((fio_ary___s *)(ary + 8))->start = 0;
      *(undefined8 *)(ary + 0x10) = 0;
    }
    *(FIOBJ *)(*(long *)(ary + 0x20) + *(long *)(ary + 0x10) * 8) = obj;
    *(long *)(ary + 0x10) = *(long *)(ary + 0x10) + 1;
    return;
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x9a,"void fiobj_ary_push(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_push(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___push(&obj2ary(ary)->ary, obj);
}